

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
               (int param_1,uint32 tag,CodedInputStream *input,RepeatedField<bool> *values)

{
  uint8 uVar1;
  byte bVar2;
  int iVar3;
  uint8 *puVar4;
  bool bVar5;
  LogMessage *other;
  byte *pbVar6;
  int iVar7;
  pair<unsigned_long,_bool> pVar8;
  pair<unsigned_long,_bool> pVar9;
  LogFinisher local_75;
  uint local_74;
  uint local_70;
  uint local_6c;
  LogMessage local_68;
  
  puVar4 = input->buffer_;
  if ((puVar4 < input->buffer_end_) && (uVar1 = *puVar4, -1 < (long)(char)uVar1)) {
    input->buffer_ = puVar4 + 1;
    pVar8._8_8_ = 1;
    pVar8.first = (long)(char)uVar1;
  }
  else {
    pVar8 = io::CodedInputStream::ReadVarint64Fallback(input);
  }
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_0026adc0:
    bVar5 = false;
  }
  else {
    if (values->current_size_ == values->total_size_) {
      RepeatedField<bool>::Reserve(values,values->total_size_ + 1);
    }
    iVar7 = values->current_size_;
    values->current_size_ = iVar7 + 1;
    values->rep_->elements[iVar7] = pVar8.first != 0;
    bVar5 = true;
    if (iVar7 + 1 < values->total_size_) {
      local_70 = tag & 0xff | 0x80;
      local_74 = tag >> 7;
      iVar7 = values->total_size_ - iVar7;
      local_6c = tag;
      do {
        if (local_6c < 0x80) {
          pbVar6 = input->buffer_;
          if ((input->buffer_end_ <= pbVar6) || (*pbVar6 != local_6c)) break;
          pbVar6 = pbVar6 + 1;
        }
        else {
          if ((((0x3fff < local_6c) ||
               (pbVar6 = input->buffer_, *(int *)&input->buffer_end_ - (int)pbVar6 < 2)) ||
              (local_70 != *pbVar6)) || (local_74 != pbVar6[1])) break;
          pbVar6 = pbVar6 + 2;
        }
        input->buffer_ = pbVar6;
        if ((pbVar6 < input->buffer_end_) && (bVar2 = *pbVar6, -1 < (long)(char)bVar2)) {
          input->buffer_ = pbVar6 + 1;
          pVar9._8_8_ = 1;
          pVar9.first = (long)(char)bVar2;
        }
        else {
          pVar9 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_0026adc0;
        if (values->total_size_ <= values->current_size_) {
          LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x452);
          other = LogMessage::operator<<
                            (&local_68,"CHECK failed: (current_size_) < (total_size_): ");
          LogFinisher::operator=(&local_75,other);
          LogMessage::~LogMessage(&local_68);
        }
        iVar3 = values->current_size_;
        values->current_size_ = iVar3 + 1;
        values->rep_->elements[iVar3] = pVar9.first != 0;
        iVar7 = iVar7 + -1;
      } while (1 < iVar7);
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

inline bool WireFormatLite::ReadRepeatedPrimitive(
    int,  // tag_size, unused.
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* values) {
  CType value;
  if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
  values->Add(value);
  int elements_already_reserved = values->Capacity() - values->size();
  while (elements_already_reserved > 0 && input->ExpectTag(tag)) {
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->AddAlreadyReserved(value);
    elements_already_reserved--;
  }
  return true;
}